

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t strncat_from_utf8_to_utf8(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_string *paVar2;
  size_t sVar3;
  char *p;
  wchar_t wVar4;
  size_t __n;
  char *pcVar5;
  uint32_t uc;
  wchar_t local_54;
  char *local_50;
  char *local_48;
  wchar_t local_3c;
  long local_38;
  
  paVar2 = archive_string_ensure(as,len + as->length + 1);
  if (paVar2 == (archive_string *)0x0) {
LAB_0055a2fa:
    wVar4 = L'\xffffffff';
  }
  else {
    p = as->s + as->length;
    local_50 = (char *)_p;
    local_48 = as->s + (as->buffer_length - 1);
    wVar4 = L'\0';
    do {
      while( true ) {
        wVar1 = _utf8_to_unicode(&uc,(char *)_p,len);
        if (wVar1 == L'\x03') break;
        if (wVar1 < L'\x01') goto LAB_0055a1a3;
LAB_0055a196:
        _p = (void *)((long)_p + (ulong)(uint)wVar1);
        len = len - (uint)wVar1;
      }
      if ((uc & 0xfffff800) != 0xd800) goto LAB_0055a196;
      wVar1 = L'\xfffffffd';
LAB_0055a1a3:
      if (local_50 < _p) {
        __n = (long)_p - (long)local_50;
        local_54 = wVar4;
        if (local_48 < p + __n) {
          as->length = (long)p - (long)as->s;
          paVar2 = archive_string_ensure(as,len + as->buffer_length + 1);
          if (paVar2 == (archive_string *)0x0) goto LAB_0055a2fa;
          p = as->s + as->length;
          local_48 = as->s + (as->buffer_length - 1);
        }
        memcpy(p,local_50,__n);
        p = p + __n;
        wVar4 = local_54;
      }
      if (L'\xffffffff' < wVar1) break;
      if ((uc & 0xfffff800) == 0xd800 && wVar1 == L'\xfffffffd') {
        wVar1 = cesu8_to_unicode(&uc,(char *)_p,len);
      }
      local_3c = -wVar1;
      if (L'\0' < wVar1) {
        local_3c = wVar1;
      }
      if (wVar1 < L'\0') {
        wVar4 = L'\xffffffff';
      }
      local_38 = len + 1;
      pcVar5 = local_48;
      local_54 = wVar4;
      local_50._0_4_ = uc;
      while (sVar3 = unicode_to_utf8(p,(long)pcVar5 - (long)p,(uint32_t)local_50), sVar3 == 0) {
        as->length = (long)p - (long)as->s;
        paVar2 = archive_string_ensure(as,as->buffer_length + local_38);
        if (paVar2 == (archive_string *)0x0) goto LAB_0055a2fa;
        p = as->s + as->length;
        pcVar5 = as->s + (as->buffer_length - 1);
      }
      p = p + sVar3;
      _p = (void *)((long)_p + (ulong)(uint)local_3c);
      len = len - (uint)local_3c;
      wVar4 = local_54;
      local_50 = (char *)_p;
      local_48 = pcVar5;
    } while (wVar1 != L'\0');
    as->length = (long)p - (long)as->s;
    *p = '\0';
  }
  return wVar4;
}

Assistant:

static int
strncat_from_utf8_to_utf8(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	int n, ret = 0;

	(void)sc; /* UNUSED */

	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length -1;
	do {
		uint32_t uc;
		const char *ss = s;
		size_t w;

		/*
		 * Forward byte sequence until a conversion of that is needed.
		 */
		while ((n = utf8_to_unicode(&uc, s, len)) > 0) {
			s += n;
			len -= n;
		}
		if (ss < s) {
			if (p + (s - ss) > endp) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}

			memcpy(p, ss, s - ss);
			p += s - ss;
		}

		/*
		 * If n is negative, current byte sequence needs a replacement.
		 */
		if (n < 0) {
			if (n == -3 && IS_SURROGATE_PAIR_LA(uc)) {
				/* Current byte sequence may be CESU-8. */
				n = cesu8_to_unicode(&uc, s, len);
			}
			if (n < 0) {
				ret = -1;
				n *= -1;/* Use a replaced unicode character. */
			}

			/* Rebuild UTF-8 byte sequence. */
			while ((w = unicode_to_utf8(p, endp - p, uc)) == 0) {
				as->length = p - as->s;
				if (archive_string_ensure(as,
				    as->buffer_length + len + 1) == NULL)
					return (-1);
				p = as->s + as->length;
				endp = as->s + as->buffer_length -1;
			}
			p += w;
			s += n;
			len -= n;
		}
	} while (n > 0);
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret);
}